

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_confined.cpp
# Opt level: O3

Reals __thiscall
Omega_h::get_pad_dists(Omega_h *this,Mesh *mesh,Int pad_dim,Read<signed_char> *edges_are_bridges)

{
  int *piVar1;
  uint uVar2;
  undefined8 uVar3;
  void *pvVar4;
  void *extraout_RDX;
  char *pcVar5;
  char *pcVar6;
  Alloc *this_00;
  Reals RVar7;
  Read<signed_char> local_78;
  Read<signed_char> local_68;
  Read<signed_char> local_58;
  Read<signed_char> local_48;
  Read<signed_char> local_38;
  Read<signed_char> local_28;
  
  if (pad_dim == 3) {
    local_28.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
    if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
        local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_28.write_.shared_alloc_.alloc =
             (Alloc *)((local_28.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_28.write_.shared_alloc_.alloc)->use_count =
             (local_28.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    this_00 = local_28.write_.shared_alloc_.alloc;
    local_28.write_.shared_alloc_.direct_ptr = (edges_are_bridges->write_).shared_alloc_.direct_ptr;
    RVar7 = get_tet_pad_dists(this,mesh,&local_28);
    pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
    if (((ulong)this_00 & 7) != 0 || this_00 == (Alloc *)0x0) goto LAB_00272113;
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) goto LAB_00272113;
    Alloc::~Alloc(this_00);
  }
  else {
    if (pad_dim == 2) {
      uVar2 = mesh->dim_;
      if (3 < uVar2) {
LAB_00272120:
        pcVar6 = "0 <= dim_ && dim_ <= 3";
        pcVar5 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
        ;
        uVar3 = 0x33;
LAB_00272156:
        fail("assertion %s failed at %s +%d\n",pcVar6,pcVar5,uVar3);
      }
      if (uVar2 == 2) {
        local_78.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
        if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
            local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_78.write_.shared_alloc_.alloc =
                 (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_78.write_.shared_alloc_.alloc)->use_count =
                 (local_78.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_78.write_.shared_alloc_.direct_ptr =
             (edges_are_bridges->write_).shared_alloc_.direct_ptr;
        RVar7 = get_tri_pad_dists<2>(this,mesh,&local_78);
        pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
        this_00 = local_78.write_.shared_alloc_.alloc;
      }
      else {
        if (uVar2 != 3) goto LAB_0027213c;
        local_68.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
        if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
            local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_68.write_.shared_alloc_.alloc =
                 (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_68.write_.shared_alloc_.alloc)->use_count =
                 (local_68.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_68.write_.shared_alloc_.direct_ptr =
             (edges_are_bridges->write_).shared_alloc_.direct_ptr;
        RVar7 = get_tri_pad_dists<3>(this,mesh,&local_68);
        pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
        this_00 = local_68.write_.shared_alloc_.alloc;
      }
    }
    else {
      if (pad_dim != 1) {
LAB_0027213c:
        pcVar6 = "false";
        pcVar5 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_confined.cpp"
        ;
        uVar3 = 0xb5;
        goto LAB_00272156;
      }
      uVar2 = mesh->dim_;
      if (3 < uVar2) goto LAB_00272120;
      if (uVar2 == 1) {
        local_58.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
        if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
            local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_58.write_.shared_alloc_.alloc =
                 (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_58.write_.shared_alloc_.alloc)->use_count =
                 (local_58.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_58.write_.shared_alloc_.direct_ptr =
             (edges_are_bridges->write_).shared_alloc_.direct_ptr;
        RVar7 = get_edge_pad_dists<1>(this,mesh,&local_58);
        pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
        this_00 = local_58.write_.shared_alloc_.alloc;
      }
      else if (uVar2 == 2) {
        local_48.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
        if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
            local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_48.write_.shared_alloc_.alloc =
                 (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_48.write_.shared_alloc_.alloc)->use_count =
                 (local_48.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_48.write_.shared_alloc_.direct_ptr =
             (edges_are_bridges->write_).shared_alloc_.direct_ptr;
        RVar7 = get_edge_pad_dists<2>(this,mesh,&local_48);
        pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
        this_00 = local_48.write_.shared_alloc_.alloc;
      }
      else {
        if (uVar2 != 3) goto LAB_0027213c;
        local_38.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
        if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
            local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_38.write_.shared_alloc_.alloc =
                 (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_38.write_.shared_alloc_.alloc)->use_count =
                 (local_38.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_38.write_.shared_alloc_.direct_ptr =
             (edges_are_bridges->write_).shared_alloc_.direct_ptr;
        RVar7 = get_edge_pad_dists<3>(this,mesh,&local_38);
        pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
        this_00 = local_38.write_.shared_alloc_.alloc;
      }
    }
    if (((ulong)this_00 & 7) != 0 || this_00 == (Alloc *)0x0) goto LAB_00272113;
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) goto LAB_00272113;
    Alloc::~Alloc(this_00);
  }
  operator_delete(this_00,0x48);
  pvVar4 = extraout_RDX;
LAB_00272113:
  RVar7.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar7.write_.shared_alloc_;
}

Assistant:

Reals get_pad_dists(Mesh* mesh, Int pad_dim, Read<I8> edges_are_bridges) {
  if (pad_dim == EDGE) {
    if (mesh->dim() == 3) {
      return get_edge_pad_dists<3>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 2) {
      return get_edge_pad_dists<2>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 1) {
      return get_edge_pad_dists<1>(mesh, edges_are_bridges);
    }
  } else if (pad_dim == FACE) {
    if (mesh->dim() == 3) {
      return get_tri_pad_dists<3>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 2) {
      return get_tri_pad_dists<2>(mesh, edges_are_bridges);
    }
  } else if (pad_dim == REGION) {
    return get_tet_pad_dists(mesh, edges_are_bridges);
  }
  OMEGA_H_NORETURN(Reals());
}